

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

xmlCharEncError UTF8ToUTF16(void *vctxt,uchar *outb,int *outlen,uchar *in,int *inlen,int flush)

{
  xmlCharEncError xVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  
  iVar3 = (int)outb;
  iVar4 = (int)in;
  if (in == (uchar *)0x0) {
    if (1 < *outlen) {
      outb[0] = 0xff;
      outb[1] = 0xfe;
      *outlen = 2;
      *inlen = 0;
      return ~XML_ENC_ERR_SPACE;
    }
    *outlen = 0;
    *inlen = 0;
    return XML_ENC_ERR_SUCCESS;
  }
  xVar1 = XML_ENC_ERR_INTERNAL;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && outb != (uchar *)0x0)) {
    if (in == (uchar *)0x0) {
      *outlen = 0;
      iVar4 = 0;
      xVar1 = XML_ENC_ERR_SUCCESS;
    }
    else {
      if (0 < (long)*inlen) {
        pbVar6 = in + *inlen;
        pbVar5 = outb + ((long)*outlen & 0xfffffffffffffffe);
        xVar1 = XML_ENC_ERR_SPACE;
        do {
          bVar9 = *in;
          if ((char)bVar9 < '\0') {
            if (bVar9 < 0xe0) {
              if (0xc1 < bVar9) {
                uVar13 = bVar9 & 0x1f;
                uVar11 = 0x80;
                lVar12 = 2;
                goto LAB_0012a908;
              }
LAB_0012a975:
              iVar2 = 4;
              xVar1 = XML_ENC_ERR_INPUT;
            }
            else {
              lVar12 = 4 - (ulong)(bVar9 < 0xf0);
              uVar11 = 0x10000;
              if (bVar9 < 0xf0) {
                uVar11 = 0x800;
              }
              uVar13 = bVar9 & 0xf;
LAB_0012a908:
              iVar2 = 3;
              if ((long)pbVar6 - (long)in < lVar12) goto LAB_0012a97a;
              lVar7 = 1;
              do {
                uVar14 = uVar13;
                iVar2 = 4;
                if ((in[lVar7] & 0xc0) != 0x80) goto LAB_0012a975;
                uVar10 = uVar14 << 6;
                uVar13 = in[lVar7] & 0x3f | uVar10;
                lVar7 = lVar7 + 1;
              } while (lVar12 != lVar7);
              if ((uVar13 < uVar11) || (0x10ffff < uVar10 || (uVar14 & 0x3ffffe0) == 0x360))
              goto LAB_0012a975;
              bVar9 = (byte)(uVar10 >> 8);
              if (uVar10 < 0x10000) {
                if (outb < pbVar5) {
                  *outb = (byte)uVar13;
                  lVar8 = 2;
                  lVar7 = 1;
LAB_0012a9f5:
                  outb[lVar7] = bVar9;
                  outb = outb + lVar8;
                  in = in + lVar12;
                  iVar2 = 0;
                }
              }
              else if (3 < (long)pbVar5 - (long)outb) {
                *outb = (byte)(uVar13 - 0x10000 >> 10);
                outb[1] = (byte)(uVar13 - 0x10000 >> 0x12) | 0xd8;
                outb[2] = (byte)uVar13;
                bVar9 = bVar9 & 3 | 0xdc;
                lVar8 = 4;
                lVar7 = 3;
                goto LAB_0012a9f5;
              }
            }
LAB_0012a97a:
            if (iVar2 != 0) {
              if (iVar2 != 3) {
                if (iVar2 != 4) {
                  return xVar1;
                }
                goto LAB_0012aa23;
              }
              break;
            }
          }
          else {
            if (pbVar5 <= outb) goto LAB_0012aa23;
            *outb = bVar9;
            outb[1] = 0;
            in = in + 1;
            outb = outb + 2;
          }
        } while (in < pbVar6);
      }
      xVar1 = (int)outb - iVar3;
LAB_0012aa23:
      *outlen = (int)outb - iVar3;
      iVar4 = (int)in - iVar4;
    }
    *inlen = iVar4;
  }
  return xVar1;
}

Assistant:

static xmlCharEncError
UTF8ToUTF16(void *vctxt,
            unsigned char* outb, int *outlen,
            const unsigned char* in, int *inlen,
            int flush) {
    if (in == NULL) {
	/*
	 * initialization, add the Byte Order Mark for UTF-16LE
	 */
        if (*outlen >= 2) {
	    outb[0] = 0xFF;
	    outb[1] = 0xFE;
	    *outlen = 2;
	    *inlen = 0;
	    return(2);
	}
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    return (UTF8ToUTF16LE(vctxt, outb, outlen, in, inlen, flush));
}